

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

void initialize_patch(pfdistances_patched *distances,loc_conflict grid,player *p,_Bool only_known,
                     _Bool forbid_traps)

{
  _Bool _Var1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  loc grid_00;
  wchar_t wVar8;
  uint *puVar9;
  wchar_t wVar10;
  
  if (((((long)grid < 0) || (wVar7 = grid.x, wVar7 < L'\0')) || (distances->height <= grid.y)) ||
     (distances->width <= wVar7)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2cb,
                  "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                 );
  }
  bVar3 = (byte)distances->patch_shift;
  wVar5 = (uint)grid.y >> (bVar3 & 0x1f);
  if (distances->npatchy <= wVar5) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2cd,
                  "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                 );
  }
  wVar7 = (uint)wVar7 >> (bVar3 & 0x1f);
  if (wVar7 < distances->npatchx) {
    if (distances->patches[(uint)wVar5][(uint)wVar7] == (int *)0x0) {
      piVar2 = (int *)mem_alloc((ulong)(uint)(distances->patch_size * distances->patch_size) << 2);
      distances->patches[(uint)wVar5][(uint)wVar7] = piVar2;
      bVar3 = (byte)distances->patch_shift;
      wVar5 = wVar5 << (bVar3 & 0x1f);
      wVar7 = wVar7 << (bVar3 & 0x1f);
      if (L'\0' < distances->patch_size) {
        iVar6 = 0;
        wVar8 = wVar5;
        do {
          if (L'\0' < distances->patch_size) {
            puVar9 = (uint *)(piVar2 + iVar6);
            wVar10 = wVar7;
            do {
              grid_00.y = wVar8;
              grid_00.x = wVar10;
              _Var1 = square_in_bounds_fully((chunk_conflict *)p->cave,grid_00);
              uVar4 = 0xffffffff;
              if (_Var1) {
                _Var1 = is_valid_pf(p,(loc_conflict)grid_00,only_known,forbid_traps);
                uVar4 = _Var1 - 1 | 0x7fffffff;
              }
              *puVar9 = uVar4;
              wVar10 = wVar10 + L'\x01';
              puVar9 = puVar9 + 1;
              iVar6 = iVar6 + 1;
            } while (wVar10 < distances->patch_size + wVar7);
          }
          wVar8 = wVar8 + L'\x01';
        } while (wVar8 < distances->patch_size + wVar5);
      }
      return;
    }
    __assert_fail("!distances->patches[patchy][patchx]",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x2d0,
                  "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
                 );
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                ,0x2cf,
                "void initialize_patch(struct pfdistances_patched *, struct loc, struct player *, _Bool, _Bool)"
               );
}

Assistant:

static void initialize_patch(struct pfdistances_patched *distances,
		struct loc grid, struct player *p, bool only_known,
		bool forbid_traps)
{
	int *block;
	int patchy, patchx, i;
	struct loc corner, cursor;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	assert(!distances->patches[patchy][patchx]);
	block = mem_alloc(distances->patch_size * distances->patch_size
		* sizeof(*block));
	distances->patches[patchy][patchx] = block;

	corner.y = patchy << distances->patch_shift;
	corner.x = patchx << distances->patch_shift;
	for (cursor.y = corner.y, i = 0; cursor.y < corner.y
			+ distances->patch_size; ++cursor.y) {
		for (cursor.x = corner.x; cursor.x < corner.x
				+ distances->patch_size; ++cursor.x, ++i) {
			block[i] = (square_in_bounds_fully(p->cave, cursor)
				&& is_valid_pf(p, cursor, only_known,
				forbid_traps)) ? INT_MAX : -1;
		}
	}
}